

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_bitswap(DisasContext_conflict6 *ctx,int opc,int rd,int rt)

{
  TCGContext_conflict6 *s;
  TCGTemp *a1;
  TCGv_i64 pTVar1;
  TCGOpcode opc_00;
  code *func;
  uintptr_t o_1;
  TCGv_i64 pTVar2;
  TCGTemp *local_30;
  
  if (rd == 0) {
    return;
  }
  s = ctx->uc->tcg_ctx;
  a1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  pTVar2 = (TCGv_i64)((long)a1 - (long)s);
  if (rt == 0) {
    opc_00 = INDEX_op_movi_i64;
    pTVar1 = (TCGv_i64)0x0;
LAB_009a72a7:
    tcg_gen_op2_mips64el(s,opc_00,(TCGArg)a1,(TCGArg)pTVar1);
  }
  else if (s->cpu_gpr[rt] != pTVar2) {
    pTVar1 = (TCGv_i64)((long)&s->pool_cur + (long)s->cpu_gpr[rt]);
    opc_00 = INDEX_op_mov_i64;
    goto LAB_009a72a7;
  }
  if (opc == 0x7c000024) {
    pTVar1 = s->cpu_gpr[(uint)rd];
    func = helper_dbitswap_mips64el;
  }
  else {
    if (opc != 0x7c000020) goto LAB_009a730d;
    pTVar1 = s->cpu_gpr[(uint)rd];
    func = helper_bitswap_mips64el;
  }
  local_30 = (TCGTemp *)((long)s + (long)pTVar2);
  tcg_gen_callN_mips64el(s,func,(TCGTemp *)((long)&s->pool_cur + (long)pTVar1),1,&local_30);
LAB_009a730d:
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar2 + (long)s));
  return;
}

Assistant:

static void gen_bitswap(DisasContext *ctx, int opc, int rd, int rt)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;
    if (rd == 0) {
        /* Treat as NOP. */
        return;
    }
    t0 = tcg_temp_new(tcg_ctx);
    gen_load_gpr(tcg_ctx, t0, rt);
    switch (opc) {
    case OPC_BITSWAP:
        gen_helper_bitswap(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0);
        break;
#if defined(TARGET_MIPS64)
    case OPC_DBITSWAP:
        gen_helper_dbitswap(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0);
        break;
#endif
    }
    tcg_temp_free(tcg_ctx, t0);
}